

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# removed_api.cpp
# Opt level: O0

void __thiscall
QFutureInterfaceBase::setContinuation
          (QFutureInterfaceBase *this,function<void_(const_QFutureInterfaceBase_&)> *func)

{
  long lVar1;
  QFutureInterfaceBase *in_RSI;
  long in_FS_OFFSET;
  function<void_(const_QFutureInterfaceBase_&)> *in_stack_ffffffffffffff98;
  function<void_(const_QFutureInterfaceBase_&)> *in_stack_ffffffffffffffa0;
  QFutureInterfaceBasePrivate *in_stack_ffffffffffffffb8;
  function<void_(const_QFutureInterfaceBase_&)> *in_stack_ffffffffffffffc0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  std::function<void_(const_QFutureInterfaceBase_&)>::function
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  setContinuation(in_RSI,in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  std::function<void_(const_QFutureInterfaceBase_&)>::~function
            ((function<void_(const_QFutureInterfaceBase_&)> *)0x1fc4b8);
  if (*(long *)(in_FS_OFFSET + 0x28) == lVar1) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QFutureInterfaceBase::setContinuation(std::function<void(const QFutureInterfaceBase &)> func)
{
    setContinuation(std::move(func), nullptr);
}